

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O3

void processColumnNoise(double *out,SeaLevelColumnNoiseBeta *src,double *climate)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar5 = src->contBSample / 8000.0;
  dVar6 = 0.0;
  dVar5 = (double)(~-(ulong)(dVar5 < 0.0) & (ulong)dVar5 |
                  (ulong)(dVar5 * -0.3) & -(ulong)(dVar5 < 0.0)) * 3.0 + -2.0;
  if (0.0 <= dVar5) {
    dVar6 = 1.0 - in_XMM0_Qa * in_XMM1_Qa;
    dVar6 = dVar6 * dVar6;
    dVar10 = (1.0 - dVar6 * dVar6) * (src->contASample + 256.0) * 0.001953125;
    dVar6 = 1.0;
    if (dVar10 <= 1.0) {
      dVar6 = dVar10;
    }
    dVar5 = (double)(-(ulong)(1.0 < dVar5) & 0x3fc0000000000000 |
                    ~-(ulong)(1.0 < dVar5) & (ulong)(dVar5 * 0.125));
  }
  else {
    uVar4 = -(ulong)(dVar5 * 0.5 < -1.0);
    dVar5 = (double)(uVar4 & 0xbfd6db6db6db6db7 | ~uVar4 & (ulong)(((dVar5 * 0.5) / 1.4) * 0.5));
  }
  lVar3 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    dVar7 = (((double)((int)lVar3 + 7) - (dVar5 * 17.0 * 0.0625 * 4.0 + 8.5)) * 12.0) /
            (double)(-(ulong)(dVar6 < 0.0) & 0x3fe0000000000000 |
                    ~-(ulong)(dVar6 < 0.0) & (ulong)(dVar6 + 0.5));
    dVar8 = src->minSample[lVar3] * 0.001953125;
    dVar9 = (src->mainSample[lVar3] / 10.0 + 1.0) * 0.5;
    dVar10 = dVar8;
    if ((0.0 <= dVar9) && (dVar10 = src->maxSample[lVar3] * 0.001953125, dVar9 <= 1.0)) {
      dVar10 = dVar8 + (dVar10 - dVar8) * dVar9;
    }
    out[lVar3] = dVar10 - (double)(~-(ulong)(dVar7 < 0.0) & (ulong)dVar7 |
                                  (ulong)(dVar7 * 4.0) & -(ulong)(dVar7 < 0.0));
    lVar3 = 1;
    bVar1 = false;
  } while (bVar2);
  return;
}

Assistant:

static void processColumnNoise(double *out, const SeaLevelColumnNoiseBeta *src,
    const double climate[2])
{
    double humi = 1 - climate[0] * climate[1];
    humi *= humi;
    humi *= humi;
    humi = 1 - humi;
    double contA = (src->contASample + 256) / 512 * humi;
    contA = (contA > 1) ? 1.0 : contA;
    double contB = src->contBSample / 8000;
    if (contB < 0)
        contB = -contB * 0.3;
    contB = contB*3-2;
    if (contB < 0)
    {
        contB /= 2;
        contB = (contB < -1) ? -1.0 / 1.4 / 2 : contB / 1.4 / 2;
        contA = 0;
    }
    else
    {
        contB = (contB > 1) ? 1.0/8 : contB/8;
    }
    contA = (contA < 0) ? 0.5 : contA+0.5;
    contB = (contB * 17.0) / 16;
    contB = 17.0 / 2 + contB * 4;
    const double *low = src->minSample;
    const double *high = src->maxSample;
    const double *selector = src->mainSample;
    int i;
    for (i = 0; i <= 1; i++)
    {
        double chooseLHS;
        double procCont = ((i + 7 - contB) * 12) / contA;
        procCont = (procCont < 0) ? procCont*4 : procCont;
        double lSample = low[i] / 512;
        double hSample = high[i] / 512;
        double sSample = (selector[i] / 10 + 1) / 2;
        chooseLHS = (sSample < 0.0) ? lSample : (sSample > 1) ? hSample :
            lSample + (hSample - lSample) * sSample;
        chooseLHS -= procCont;
        out[i] = chooseLHS;
    }
}